

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TreePushOverrideID(ImGuiID id)

{
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindow *v;
  ImGuiContext *this;
  
  v = GImGui->CurrentWindow;
  this = GImGui;
  Indent(window._4_4_);
  (v->DC).TreeDepth = (v->DC).TreeDepth + 1;
  ImVector<unsigned_int>::push_back((ImVector<unsigned_int> *)this,(uint *)v);
  return;
}

Assistant:

void ImGui::TreePushOverrideID(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    Indent();
    window->DC.TreeDepth++;
    window->IDStack.push_back(id);
}